

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O3

lzma_ret validate_chain(lzma_filter *filters,size_t *count)

{
  long lVar1;
  lzma_ret lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  anon_struct_24_5_040317c8 *paVar6;
  byte bVar7;
  lzma_vli lVar8;
  
  lVar2 = LZMA_PROG_ERROR;
  if ((filters != (lzma_filter *)0x0) && (lVar8 = filters->id, lVar8 != 0xffffffffffffffff)) {
    bVar7 = 1;
    uVar4 = 0;
    uVar5 = 0;
    do {
      paVar6 = features;
      if (lVar8 != 0x4000000000000001) {
        lVar1 = 0;
        do {
          lVar3 = lVar1;
          if (lVar3 + 0x18 == 0xf0) {
            return LZMA_OPTIONS_ERROR;
          }
          lVar1 = lVar3 + 0x18;
        } while (lVar8 != *(lzma_vli *)((long)&features[1].id + lVar3));
        paVar6 = (anon_struct_24_5_040317c8 *)(lVar3 + 0x25ed78);
      }
      lVar2 = LZMA_OPTIONS_ERROR;
      if ((bVar7 & 1) == 0) {
        return LZMA_OPTIONS_ERROR;
      }
      bVar7 = paVar6->non_last_ok;
      uVar4 = uVar4 + paVar6->changes_size;
      uVar5 = uVar5 + 1;
      lVar8 = filters[uVar5].id;
    } while (lVar8 != 0xffffffffffffffff);
    if (((uVar5 < 5) && (paVar6->last_ok != false)) && (uVar4 < 4)) {
      *count = uVar5;
      lVar2 = LZMA_OK;
    }
  }
  return lVar2;
}

Assistant:

static lzma_ret
validate_chain(const lzma_filter *filters, size_t *count)
{
	// There must be at least one filter.
	if (filters == NULL || filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	// Number of non-last filters that may change the size of the data
	// significantly (that is, more than 1-2 % or so).
	size_t changes_size_count = 0;

	// True if it is OK to add a new filter after the current filter.
	bool non_last_ok = true;

	// True if the last filter in the given chain is actually usable as
	// the last filter. Only filters that support embedding End of Payload
	// Marker can be used as the last filter in the chain.
	bool last_ok = false;

	size_t i = 0;
	do {
		size_t j;
		for (j = 0; filters[i].id != features[j].id; ++j)
			if (features[j].id == LZMA_VLI_UNKNOWN)
				return LZMA_OPTIONS_ERROR;

		// If the previous filter in the chain cannot be a non-last
		// filter, the chain is invalid.
		if (!non_last_ok)
			return LZMA_OPTIONS_ERROR;

		non_last_ok = features[j].non_last_ok;
		last_ok = features[j].last_ok;
		changes_size_count += features[j].changes_size;

	} while (filters[++i].id != LZMA_VLI_UNKNOWN);

	// There must be 1-4 filters. The last filter must be usable as
	// the last filter in the chain. A maximum of three filters are
	// allowed to change the size of the data.
	if (i > LZMA_FILTERS_MAX || !last_ok || changes_size_count > 3)
		return LZMA_OPTIONS_ERROR;

	*count = i;
	return LZMA_OK;
}